

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3rbu_step(sqlite3rbu *p)

{
  u32 uVar1;
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  bool bVar5;
  RbuFrame *pFrame;
  long lStack_38;
  u32 iSector;
  void *ptr;
  sqlite3_file *pDb;
  RbuObjIter *pRStack_20;
  int rc;
  RbuObjIter *pIter;
  sqlite3rbu *p_local;
  
  if (p == (sqlite3rbu *)0x0) {
    p_local._4_4_ = 7;
  }
  else {
    iVar3 = p->eStage;
    pIter = (RbuObjIter *)p;
    if (iVar3 == 1) {
      pRStack_20 = &p->objiter;
      if (((p->zTarget == (char *)0x0) && (p->nProgress == 0)) && (p->rc == 0)) {
        rbuCreateTargetSchema(p);
        rbuCopyPragma((sqlite3rbu *)pIter,"user_version");
        rbuCopyPragma((sqlite3rbu *)pIter,"application_id");
      }
      while( true ) {
        bVar5 = false;
        if (*(int *)&pIter->abNotNull == 0) {
          bVar5 = pRStack_20->zTbl != (char *)0x0;
        }
        if (!bVar5) break;
        if (pRStack_20->bCleanup == 0) {
          rbuObjIterPrepareAll((sqlite3rbu *)pIter,pRStack_20,0);
          if (*(int *)&pIter->abNotNull == 0) {
            pDb._4_4_ = sqlite3_step(pRStack_20->pSelect);
            if (pDb._4_4_ == 100) {
              pIter->bCleanup = pIter->bCleanup + 1;
              pIter->eType = pIter->eType + 1;
              iVar3 = rbuStep((sqlite3rbu *)pIter);
              return iVar3;
            }
            iVar3 = sqlite3_reset(pRStack_20->pSelect);
            *(int *)&pIter->abNotNull = iVar3;
            pIter->eType = 0;
          }
        }
        else if ((pIter->azTblCol != (char **)0x0) && (pRStack_20->abIndexed != (u8 *)0x0)) {
          rbuMPrintfExec((sqlite3rbu *)pIter,*(sqlite3 **)&pIter->nTblCol,
                         "DELETE FROM %s.\'rbu_tmp_%q\'",&pIter->abTblPk,pRStack_20->zDataTbl);
        }
        rbuObjIterNext((sqlite3rbu *)pIter,pRStack_20);
      }
      if (*(int *)&pIter->abNotNull == 0) {
        rbuSaveState((sqlite3rbu *)pIter,2);
        rbuIncrSchemaCookie((sqlite3rbu *)pIter);
        if (*(int *)&pIter->abNotNull == 0) {
          iVar3 = sqlite3_exec((sqlite3 *)pIter->pIdxIter,"COMMIT",(sqlite3_callback)0x0,(void *)0x0
                               ,(char **)&pIter->abIndexed);
          *(int *)&pIter->abNotNull = iVar3;
        }
        if (*(int *)&pIter->abNotNull == 0) {
          iVar3 = sqlite3_exec(*(sqlite3 **)&pIter->nTblCol,"COMMIT",(sqlite3_callback)0x0,
                               (void *)0x0,(char **)&pIter->abIndexed);
          *(int *)&pIter->abNotNull = iVar3;
        }
        *(undefined4 *)&pIter->pTblIter = 2;
      }
    }
    else if (iVar3 == 2) {
      if (p->rc == 0) {
        rbuMoveOalFile(p);
        pIter->bCleanup = pIter->bCleanup + 1;
      }
    }
    else if ((iVar3 == 4) && (p->rc == 0)) {
      if (p->nStep < p->nFrame) {
        do {
          uVar1 = ((RbuFrame *)(pIter[1].pInsert + (long)pIter->eType * 8))->iDbPage;
          uVar2 = *(uint *)&pIter[1].zIdx;
          rbuCheckpointFrame((sqlite3rbu *)pIter,
                             (RbuFrame *)(pIter[1].pInsert + (long)pIter->eType * 8));
          pIter->eType = pIter->eType + 1;
          bVar5 = false;
          if ((pIter->eType < *(int *)&pIter[1].pSelect) &&
             (bVar5 = false,
             (uVar1 - 1) / uVar2 ==
             (*(int *)(pIter[1].pInsert + (long)pIter->eType * 8) - 1U) / *(uint *)&pIter[1].zIdx))
          {
            bVar5 = *(int *)&pIter->abNotNull == 0;
          }
        } while (bVar5);
      }
      else {
        ptr = p->pTargetFd->pReal;
        iVar3 = (*((sqlite3_file *)ptr)->pMethods->xSync)((sqlite3_file *)ptr,2);
        *(int *)&pIter->abNotNull = iVar3;
        if (*(int *)&pIter->abNotNull == 0) {
          uVar4 = (**(code **)(*ptr + 0x68))(ptr,0,0x8000,0,&stack0xffffffffffffffc8);
          *(undefined4 *)&pIter->abNotNull = uVar4;
          if (*(int *)&pIter->abNotNull == 0) {
            *(int *)(lStack_38 + 0x60) = pIter[1].nCol;
          }
        }
        if (*(int *)&pIter->abNotNull == 0) {
          *(undefined4 *)&pIter->pTblIter = 5;
          *(undefined4 *)&pIter->abNotNull = 0x65;
        }
      }
      pIter->bCleanup = pIter->bCleanup + 1;
    }
    p_local._4_4_ = *(int *)&pIter->abNotNull;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3rbu_step(sqlite3rbu *p){
  if( p ){
    switch( p->eStage ){
      case RBU_STAGE_OAL: {
        RbuObjIter *pIter = &p->objiter;

        /* If this is an RBU vacuum operation and the state table was empty
        ** when this handle was opened, create the target database schema. */
        if( rbuIsVacuum(p) && p->nProgress==0 && p->rc==SQLITE_OK ){
          rbuCreateTargetSchema(p);
          rbuCopyPragma(p, "user_version");
          rbuCopyPragma(p, "application_id");
        }

        while( p->rc==SQLITE_OK && pIter->zTbl ){

          if( pIter->bCleanup ){
            /* Clean up the rbu_tmp_xxx table for the previous table. It 
            ** cannot be dropped as there are currently active SQL statements.
            ** But the contents can be deleted.  */
            if( rbuIsVacuum(p)==0 && pIter->abIndexed ){
              rbuMPrintfExec(p, p->dbRbu, 
                  "DELETE FROM %s.'rbu_tmp_%q'", p->zStateDb, pIter->zDataTbl
              );
            }
          }else{
            rbuObjIterPrepareAll(p, pIter, 0);

            /* Advance to the next row to process. */
            if( p->rc==SQLITE_OK ){
              int rc = sqlite3_step(pIter->pSelect);
              if( rc==SQLITE_ROW ){
                p->nProgress++;
                p->nStep++;
                return rbuStep(p);
              }
              p->rc = sqlite3_reset(pIter->pSelect);
              p->nStep = 0;
            }
          }

          rbuObjIterNext(p, pIter);
        }

        if( p->rc==SQLITE_OK ){
          assert( pIter->zTbl==0 );
          rbuSaveState(p, RBU_STAGE_MOVE);
          rbuIncrSchemaCookie(p);
          if( p->rc==SQLITE_OK ){
            p->rc = sqlite3_exec(p->dbMain, "COMMIT", 0, 0, &p->zErrmsg);
          }
          if( p->rc==SQLITE_OK ){
            p->rc = sqlite3_exec(p->dbRbu, "COMMIT", 0, 0, &p->zErrmsg);
          }
          p->eStage = RBU_STAGE_MOVE;
        }
        break;
      }

      case RBU_STAGE_MOVE: {
        if( p->rc==SQLITE_OK ){
          rbuMoveOalFile(p);
          p->nProgress++;
        }
        break;
      }

      case RBU_STAGE_CKPT: {
        if( p->rc==SQLITE_OK ){
          if( p->nStep>=p->nFrame ){
            sqlite3_file *pDb = p->pTargetFd->pReal;
  
            /* Sync the db file */
            p->rc = pDb->pMethods->xSync(pDb, SQLITE_SYNC_NORMAL);
  
            /* Update nBackfill */
            if( p->rc==SQLITE_OK ){
              void volatile *ptr;
              p->rc = pDb->pMethods->xShmMap(pDb, 0, 32*1024, 0, &ptr);
              if( p->rc==SQLITE_OK ){
                ((u32 volatile*)ptr)[24] = p->iMaxFrame;
              }
            }
  
            if( p->rc==SQLITE_OK ){
              p->eStage = RBU_STAGE_DONE;
              p->rc = SQLITE_DONE;
            }
          }else{
            /* At one point the following block copied a single frame from the
            ** wal file to the database file. So that one call to sqlite3rbu_step()
            ** checkpointed a single frame. 
            **
            ** However, if the sector-size is larger than the page-size, and the
            ** application calls sqlite3rbu_savestate() or close() immediately
            ** after this step, then rbu_step() again, then a power failure occurs,
            ** then the database page written here may be damaged. Work around
            ** this by checkpointing frames until the next page in the aFrame[]
            ** lies on a different disk sector to the current one. */
            u32 iSector;
            do{
              RbuFrame *pFrame = &p->aFrame[p->nStep];
              iSector = (pFrame->iDbPage-1) / p->nPagePerSector;
              rbuCheckpointFrame(p, pFrame);
              p->nStep++;
            }while( p->nStep<p->nFrame 
                 && iSector==((p->aFrame[p->nStep].iDbPage-1) / p->nPagePerSector)
                 && p->rc==SQLITE_OK
            );
          }
          p->nProgress++;
        }
        break;
      }

      default:
        break;
    }
    return p->rc;
  }else{
    return SQLITE_NOMEM;
  }
}